

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Reader::decodeString(Reader *this,Token *token)

{
  Value *pVVar1;
  long in_RSI;
  long in_RDI;
  string *in_stack_00000028;
  Token *in_stack_00000030;
  Reader *in_stack_00000038;
  string decoded;
  Value *in_stack_ffffffffffffff58;
  Value *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  Value *in_stack_ffffffffffffff70;
  Value *in_stack_ffffffffffffff90;
  string local_38 [32];
  long local_18;
  byte local_1;
  
  local_18 = in_RSI;
  std::__cxx11::string::string(local_38);
  local_1 = decodeString(in_stack_00000038,in_stack_00000030,in_stack_00000028);
  if ((bool)local_1) {
    Value::Value(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    currentValue((Reader *)0x127bcd);
    Value::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    Value::~Value(in_stack_ffffffffffffff90);
    pVVar1 = currentValue((Reader *)0x127bf9);
    Value::setOffsetStart(pVVar1,*(long *)(local_18 + 8) - *(long *)(in_RDI + 0xc0));
    pVVar1 = currentValue((Reader *)0x127c31);
    Value::setOffsetLimit(pVVar1,*(long *)(local_18 + 0x10) - *(long *)(in_RDI + 0xc0));
  }
  std::__cxx11::string::~string(local_38);
  return (bool)(local_1 & 1);
}

Assistant:

bool Reader::decodeString(Token& token) {
  std::string decoded;
  if (!decodeString(token, decoded))
    return false;
  currentValue() = decoded;
  currentValue().setOffsetStart(token.start_ - begin_);
  currentValue().setOffsetLimit(token.end_ - begin_);
  return true;
}